

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_signparameter.cpp
# Opt level: O2

void __thiscall
SignParameter_PubkeyDataConstructorTest_Test::SignParameter_PubkeyDataConstructorTest_Test
          (SignParameter_PubkeyDataConstructorTest_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_002a0518;
  return;
}

Assistant:

TEST(SignParameter, PubkeyDataConstructorTest)
{
  const Pubkey expect_pubkey("0369809d2cfc44f823249169f44bf9de20fc6ed1d88482540831289947f7e82af5");
  // constructor
  SignParameter sign_parameter = SignParameter(expect_pubkey);
  CompareSignparameter(sign_parameter, expect_pubkey.GetData(),
      SignDataType::kPubkey, Pubkey(), false, SigHashType(),
      expect_pubkey.GetData());
}